

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanHexCharRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (0 < (long)end - (long)ptr) {
    cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    if (cVar1 != '\x18' && cVar1 != '\x19') {
      *nextTokPtr = ptr;
      return 0;
    }
    for (end_local = ptr + 1; 0 < (long)end - (long)end_local; end_local = end_local + 1) {
      cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*end_local);
      if (cVar1 == '\x12') {
        *nextTokPtr = end_local + 1;
        return 10;
      }
      if (cVar1 != '\x18' && cVar1 != '\x19') {
        *nextTokPtr = end_local;
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int PTRCALL
PREFIX(scanHexCharRef)(const ENCODING *enc, const char *ptr,
                       const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    for (ptr += MINBPC(enc); HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_DIGIT:
      case BT_HEX:
        break;
      case BT_SEMI:
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_CHAR_REF;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
    }
  }
  return XML_TOK_PARTIAL;
}